

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void color_tree_add(ColorTree *tree,uchar r,uchar g,uchar b,uchar a,uint index)

{
  uint uVar1;
  ColorTree *pCVar2;
  undefined3 in_register_00000009;
  undefined3 in_register_00000011;
  uint uVar3;
  undefined3 in_register_00000031;
  undefined7 in_register_00000081;
  ulong uVar4;
  
  uVar4 = CONCAT71(in_register_00000081,a);
  for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
    uVar1 = ((uint)uVar4 >> (uVar3 & 0x1f) & 1) +
            (CONCAT31(in_register_00000011,g) >> (uVar3 & 0x1f) & 1) * 4 +
            (CONCAT31(in_register_00000031,r) >> (uVar3 & 0x1f) & 1) * 8 +
            (CONCAT31(in_register_00000009,b) >> (uVar3 & 0x1f) & 1) * 2;
    pCVar2 = tree->children[uVar1];
    if (pCVar2 == (ColorTree *)0x0) {
      pCVar2 = (ColorTree *)malloc(0x88);
      tree->children[uVar1] = pCVar2;
      color_tree_init(pCVar2);
      uVar4 = CONCAT71(in_register_00000081,a) & 0xffffffff;
      pCVar2 = tree->children[uVar1];
    }
    tree = pCVar2;
  }
  tree->index = index;
  return;
}

Assistant:

static void color_tree_add(ColorTree* tree,
                           unsigned char r, unsigned char g, unsigned char b, unsigned char a, unsigned index)
{
  int bit;
  for(bit = 0; bit < 8; ++bit)
  {
    int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
    if(!tree->children[i])
    {
      tree->children[i] = (ColorTree*)lodepng_malloc(sizeof(ColorTree));
      color_tree_init(tree->children[i]);
    }
    tree = tree->children[i];
  }
  tree->index = (int)index;
}